

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::InternalSwap(Reflection *this,Message *lhs,Message *rhs)

{
  ReflectionSchema *this_00;
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  intptr_t iVar4;
  undefined8 uVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  CppStringType CVar9;
  OneofDescriptor *oneof_descriptor;
  ulong uVar10;
  Descriptor *pDVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  FieldDescriptor *pFVar17;
  uint uVar18;
  uint *puVar19;
  
  if (lhs == rhs) {
    return;
  }
  iVar4 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  (lhs->super_MessageLite)._internal_metadata_.ptr_ =
       (rhs->super_MessageLite)._internal_metadata_.ptr_;
  (rhs->super_MessageLite)._internal_metadata_.ptr_ = iVar4;
  if (-1 < this->last_non_weak_field_index_) {
    lVar13 = 0;
    lVar14 = 0;
    do {
      if (this->descriptor_->field_count_ <= lVar14) {
        InternalSwap();
        goto LAB_00414133;
      }
      pFVar17 = (FieldDescriptor *)(&this->descriptor_->fields_->super_SymbolBase + lVar13);
      bVar6 = internal::ReflectionSchema::InRealOneof(&this->schema_,pFVar17);
      if ((!bVar6) && (bVar6 = internal::ReflectionSchema::IsSplit(&this->schema_,pFVar17), !bVar6))
      {
        UnsafeShallowSwapField(this,lhs,rhs,pFVar17);
      }
      lVar13 = lVar13 + 0x58;
      bVar6 = lVar14 < this->last_non_weak_field_index_;
      lVar14 = lVar14 + 1;
    } while (bVar6);
  }
  this_00 = &this->schema_;
  if ((this->schema_).split_offset_ != -1) {
    uVar7 = internal::ReflectionSchema::SplitOffset(this_00);
    if ((this->schema_).split_offset_ == -1) goto LAB_00414148;
    uVar8 = internal::ReflectionSchema::SplitOffset(this_00);
    uVar5 = *(undefined8 *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar7);
    *(undefined8 *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) =
         *(undefined8 *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    *(undefined8 *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) = uVar5;
  }
  iVar16 = this->descriptor_->real_oneof_decl_count_;
  if (0 < iVar16) {
    iVar15 = 0;
    do {
      oneof_descriptor = Descriptor::real_oneof_decl(this->descriptor_,iVar15);
      SwapOneofField<true>(this,lhs,rhs,oneof_descriptor);
      iVar15 = iVar15 + 1;
    } while (iVar16 != iVar15);
  }
  if ((this->schema_).has_bits_offset_ != -1) {
    uVar7 = internal::ReflectionSchema::HasBitsOffset(this_00);
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_00414152;
    uVar8 = internal::ReflectionSchema::HasBitsOffset(this_00);
    pDVar11 = this->descriptor_;
    if (0 < pDVar11->field_count_) {
      lVar14 = 0;
      lVar13 = 0;
      iVar16 = 0;
      do {
        bVar6 = internal::cpp::HasHasbit
                          ((FieldDescriptor *)(&pDVar11->fields_->super_SymbolBase + lVar14));
        iVar16 = iVar16 + (uint)bVar6;
        lVar13 = lVar13 + 1;
        pDVar11 = this->descriptor_;
        lVar14 = lVar14 + 0x58;
      } while (lVar13 < pDVar11->field_count_);
      if (iVar16 != 0) {
        uVar10 = 0;
        do {
          uVar2 = *(undefined4 *)
                   ((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar10 * 4 + (ulong)uVar7);
          *(undefined4 *)
           ((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar10 * 4 + (ulong)uVar7) =
               *(undefined4 *)
                ((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar10 * 4 + (ulong)uVar8);
          *(undefined4 *)
           ((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar10 * 4 + (ulong)uVar8) = uVar2;
          uVar10 = uVar10 + 1;
        } while (iVar16 + 0x1fU >> 5 != uVar10);
      }
    }
  }
  if ((this->schema_).inlined_string_donated_offset_ == -1) {
LAB_004140dd:
    if ((this->schema_).extensions_offset_ == -1) {
      return;
    }
    uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    uVar8 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    internal::ExtensionSet::InternalSwap
              ((ExtensionSet *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),
               (ExtensionSet *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar8));
    return;
  }
  uVar7 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
  if ((this->schema_).inlined_string_donated_offset_ != -1) {
    uVar8 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    pDVar11 = this->descriptor_;
    if (pDVar11->field_count_ < 1) {
      uVar18 = 0;
    }
    else {
      lVar14 = 0;
      lVar13 = 0;
      iVar16 = 0;
      do {
        pFVar17 = pDVar11->fields_;
        if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar17->type_)[lVar14] * 4) ==
             9) && (bVar1 = (&pFVar17->field_0x1)[lVar14], (bVar1 & 8) == 0)) {
          if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) goto LAB_00414133;
          if ((bVar1 & 0x20) == 0) {
            pFVar17 = (FieldDescriptor *)(&pFVar17->super_SymbolBase + lVar14);
            bVar6 = internal::ReflectionSchema::InRealOneof(this_00,pFVar17);
            if ((!bVar6) && (CVar9 = FieldDescriptor::cpp_string_type(pFVar17), CVar9 == kString)) {
              bVar6 = internal::ReflectionSchema::IsFieldInlined(this_00,pFVar17);
              iVar16 = iVar16 + (uint)bVar6;
            }
          }
        }
        lVar13 = lVar13 + 1;
        pDVar11 = this->descriptor_;
        lVar14 = lVar14 + 0x58;
      } while (lVar13 < pDVar11->field_count_);
      if (iVar16 == 0) {
        uVar18 = 0;
      }
      else {
        iVar15 = iVar16 + 0x3f;
        if (-1 < iVar16 + 0x20) {
          iVar15 = iVar16 + 0x20;
        }
        uVar18 = iVar15 >> 5;
      }
    }
    puVar19 = (uint *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar7);
    puVar12 = (uint *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    if (((*puVar12 ^ *puVar19) & 1) == 0) {
      if (0 < (int)uVar18) {
        uVar10 = 0;
        do {
          uVar3 = puVar19[uVar10];
          puVar19[uVar10] = puVar12[uVar10];
          puVar12[uVar10] = uVar3;
          uVar10 = uVar10 + 1;
        } while (uVar18 != uVar10);
      }
      goto LAB_004140dd;
    }
    goto LAB_00414166;
  }
LAB_0041415c:
  InternalSwap();
LAB_00414166:
  InternalSwap();
LAB_00414133:
  InternalSwap();
LAB_00414148:
  InternalSwap();
LAB_00414152:
  InternalSwap();
  goto LAB_0041415c;
}

Assistant:

void Reflection::InternalSwap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  MutableInternalMetadata(lhs)->InternalSwap(MutableInternalMetadata(rhs));

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    if (schema_.IsSplit(field)) {
      continue;
    }
    UnsafeShallowSwapField(lhs, rhs, field);
  }
  if (schema_.IsSplit()) {
    std::swap(*MutableSplitField(lhs), *MutableSplitField(rhs));
  }
  const int oneof_decl_count = descriptor_->real_oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->real_oneof_decl(i);
    SwapOneofField<true>(lhs, rhs, oneof);
  }

  // Swapping bits need to happen after swapping fields, because the latter may
  // depend on the has bit information.
  if (schema_.HasHasbits()) {
    uint32_t* lhs_has_bits = MutableHasBits(lhs);
    uint32_t* rhs_has_bits = MutableHasBits(rhs);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (internal::cpp::HasHasbit(field)) {
        ++fields_with_has_bits;
      }
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(lhs_has_bits[i], rhs_has_bits[i]);
    }
  }

  if (schema_.HasInlinedString()) {
    uint32_t* lhs_donated_array = MutableInlinedStringDonatedArray(lhs);
    uint32_t* rhs_donated_array = MutableInlinedStringDonatedArray(rhs);
    int inlined_string_count = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_STRING) continue;
      if (field->is_extension() || field->is_repeated() ||
          schema_.InRealOneof(field) ||
          field->cpp_string_type() != FieldDescriptor::CppStringType::kString ||
          !IsInlined(field)) {
        continue;
      }
      inlined_string_count++;
    }

    int donated_array_size = inlined_string_count == 0
                                 ? 0
                                 // One extra bit for the arena dtor tracking.
                                 : (inlined_string_count + 1 + 31) / 32;
    ABSL_CHECK_EQ((lhs_donated_array[0] & 0x1u) == 0,
                  (rhs_donated_array[0] & 0x1u) == 0);
    for (int i = 0; i < donated_array_size; i++) {
      std::swap(lhs_donated_array[i], rhs_donated_array[i]);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(lhs)->InternalSwap(MutableExtensionSet(rhs));
  }
}